

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

Value * duckdb::DebugVerifyVectorSetting::GetSetting
                  (Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  string local_50;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  EnumUtil::ToString<duckdb::DebugVectorVerification>
            (&local_30,(pDVar1->options).debug_verify_vector);
  StringUtil::Lower(&local_50,&local_30);
  Value::Value(__return_storage_ptr__,&local_50);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value DebugVerifyVectorSetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(StringUtil::Lower(EnumUtil::ToString(config.options.debug_verify_vector)));
}